

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O1

int run_slave_process(Options *opts,Options *replayer_opts,
                     vector<const_char_*,_std::allocator<const_char_*>_> *databases)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ulonglong uVar6;
  long lVar7;
  uint *puVar8;
  undefined8 *puVar9;
  __hashtable *__h;
  byte bVar10;
  sigset_t mask;
  char ignored_shader_module_hash [18];
  Options tmp_opts;
  sigset_t old_mask;
  ThreadedReplayer replayer;
  _union_1457 local_10d0;
  sigset_t local_10c8;
  undefined4 local_1048;
  char local_1038 [24];
  undefined1 local_1020 [8];
  _Alloc_hider local_1018;
  char local_1008 [16];
  _Alloc_hider local_ff8;
  char local_fe8 [16];
  _Alloc_hider local_fd8;
  char local_fc8 [16];
  _Alloc_hider local_fb8;
  char local_fa8 [16];
  _Alloc_hider local_f98;
  char local_f88 [16];
  _Alloc_hider local_f78;
  char local_f68 [16];
  _Alloc_hider local_f58;
  char local_f48 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f38;
  undefined8 local_f20 [7];
  code *local_ee8;
  code *local_ed8;
  uint local_ed0;
  __sigset_t local_ec8;
  ThreadedReplayer local_e48;
  
  bVar10 = 0;
  alt_stack.ss_sp = (void *)0x0;
  alt_stack.ss_flags = 0;
  alt_stack._12_4_ = 0;
  alt_stack.ss_size = 0;
  alt_stack.ss_sp = malloc(0x100000);
  alt_stack.ss_size = 0x100000;
  alt_stack._8_8_ = alt_stack._8_8_ & 0xffffffff00000000;
  iVar2 = sigaltstack((sigaltstack *)&alt_stack,(sigaltstack *)0x0);
  if (iVar2 < 0) {
    return 1;
  }
  local_1020[0] = replayer_opts->spirv_validate;
  local_1020[1] = replayer_opts->pipeline_stats;
  local_1020[2] = replayer_opts->disable_signal_handler;
  local_1020[3] = replayer_opts->disable_rate_limiter;
  local_1018._M_p = local_1008;
  pcVar1 = (replayer_opts->on_disk_pipeline_cache_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1018,pcVar1,
             pcVar1 + (replayer_opts->on_disk_pipeline_cache_path)._M_string_length);
  local_ff8._M_p = local_fe8;
  pcVar1 = (replayer_opts->on_disk_validation_cache_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ff8,pcVar1,
             pcVar1 + (replayer_opts->on_disk_validation_cache_path)._M_string_length);
  local_fd8._M_p = local_fc8;
  pcVar1 = (replayer_opts->on_disk_validation_whitelist_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_fd8,pcVar1,
             pcVar1 + (replayer_opts->on_disk_validation_whitelist_path)._M_string_length);
  local_fb8._M_p = local_fa8;
  pcVar1 = (replayer_opts->on_disk_validation_blacklist_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_fb8,pcVar1,
             pcVar1 + (replayer_opts->on_disk_validation_blacklist_path)._M_string_length);
  local_f98._M_p = local_f88;
  pcVar1 = (replayer_opts->on_disk_module_identifier_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f98,pcVar1,
             pcVar1 + (replayer_opts->on_disk_module_identifier_path)._M_string_length);
  local_f78._M_p = local_f68;
  pcVar1 = (replayer_opts->pipeline_stats_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f78,pcVar1,
             pcVar1 + (replayer_opts->pipeline_stats_path)._M_string_length);
  local_f58._M_p = local_f48;
  pcVar1 = (replayer_opts->replayer_cache_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f58,pcVar1,
             pcVar1 + (replayer_opts->replayer_cache_path)._M_string_length);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_f38,&replayer_opts->implicit_whitelist_database_indices);
  puVar8 = &replayer_opts->num_threads;
  puVar9 = local_f20;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *(undefined8 *)puVar8;
    puVar8 = puVar8 + (ulong)bVar10 * -4 + 2;
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  local_ed0 = replayer_opts->timeout_seconds;
  local_ee8 = thread_callback;
  local_ed8 = validation_error_cb;
  ThreadedReplayer::ThreadedReplayer(&local_e48,opts,(Options *)local_1020);
  local_e48.robustness = true;
  do {
    pcVar4 = fgets(local_1038,0x12,_stdin);
    if (pcVar4 == (char *)0x0) break;
    piVar5 = __errno_location();
    *piVar5 = 0;
    uVar6 = strtoull(local_1038,(char **)0x0,0x10);
    if (uVar6 == 0) break;
    if (*piVar5 == 0) {
      local_10d0 = (_union_1457)&local_e48.masked_shader_modules;
      local_ec8.__val[0] = uVar6;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_e48.masked_shader_modules,&local_ec8,&local_10d0);
    }
  } while (uVar6 != 0);
  iVar2 = 1;
  crash_fd = dup(1);
  close(1);
  global_replayer = &local_e48;
  if (replayer_opts->disable_signal_handler == false) {
    memset(&local_10d0,0,0x98);
    sigemptyset(&local_10c8);
    local_10d0.sa_handler = crash_handler;
    local_1048 = 0x88000000;
    iVar3 = sigaction(0xb,(sigaction *)&local_10d0,(sigaction *)0x0);
    if ((((iVar3 < 0) || (iVar3 = sigaction(8,(sigaction *)&local_10d0,(sigaction *)0x0), iVar3 < 0)
         ) || (iVar3 = sigaction(4,(sigaction *)&local_10d0,(sigaction *)0x0), iVar3 < 0)) ||
       ((iVar3 = sigaction(7,(sigaction *)&local_10d0,(sigaction *)0x0), iVar3 < 0 ||
        (iVar3 = sigaction(6,(sigaction *)&local_10d0,(sigaction *)0x0), iVar3 < 0)))) {
      iVar2 = 1;
      goto LAB_00133167;
    }
  }
  sigemptyset((sigset_t *)&local_10d0);
  sigaddset((sigset_t *)&local_10d0,6);
  iVar3 = pthread_sigmask(0,(__sigset_t *)&local_10d0,&local_ec8);
  if (-1 < iVar3) {
    iVar2 = run_normal_process(&local_e48,databases,(char *)0x0,0,(long)Global::metadata_fd);
    global_replayer = (ThreadedReplayer *)0x0;
    if (replayer_opts->disable_signal_handler == false) {
      signal(0xb,(__sighandler_t)0x0);
      signal(8,(__sighandler_t)0x0);
      signal(4,(__sighandler_t)0x0);
      signal(7,(__sighandler_t)0x0);
      signal(6,(__sighandler_t)0x0);
    }
    pthread_sigmask(2,&local_ec8,(__sigset_t *)0x0);
    free(alt_stack.ss_sp);
  }
LAB_00133167:
  ThreadedReplayer::~ThreadedReplayer(&local_e48);
  ThreadedReplayer::Options::~Options((Options *)local_1020);
  return iVar2;
}

Assistant:

static int run_slave_process(const VulkanDevice::Options &opts,
                             const ThreadedReplayer::Options &replayer_opts,
                             const vector<const char *> &databases)
{
	// Just in case the driver crashed due to stack overflow,
	// provide an alternate stack where we can clean up "safely".
	alt_stack = {};
	alt_stack.ss_sp = malloc(1024 * 1024);
	alt_stack.ss_size = 1024 * 1024;
	alt_stack.ss_flags = 0;
	if (sigaltstack(&alt_stack, nullptr) < 0)
		return EXIT_FAILURE;

	auto tmp_opts = replayer_opts;
	tmp_opts.on_thread_callback = thread_callback;
	tmp_opts.on_validation_error_callback = validation_error_cb;
	ThreadedReplayer replayer(opts, tmp_opts);
	replayer.robustness = true;

	// In slave mode, we can receive a list of shader module hashes we should ignore.
	// This is to avoid trying to replay the same faulty shader modules again and again.
	char ignored_shader_module_hash[16 + 2];
	while (fgets(ignored_shader_module_hash, sizeof(ignored_shader_module_hash), stdin))
	{
		errno = 0;
		auto hash = strtoull(ignored_shader_module_hash, nullptr, 16);
		if (hash == 0)
			break;
		if (errno == 0)
		{
			//LOGE("Ignoring module %llx\n", hash);
			replayer.mask_shader_module(Hash(hash));
		}
	}

	// Make sure that the driver cannot mess up the master process by writing random data to stdout.
	crash_fd = dup(STDOUT_FILENO);
	close(STDOUT_FILENO);

	global_replayer = &replayer;

	if (!replayer_opts.disable_signal_handler)
	{
		// Install the signal handlers.
		// It's very important that this runs in a single thread,
		// so we cannot have some rogue thread overriding these handlers.
		struct sigaction act;
		memset(&act, 0, sizeof(act));
		sigemptyset(&act.sa_mask);
		act.sa_handler = crash_handler;
		act.sa_flags = SA_RESETHAND | SA_ONSTACK;

		if (sigaction(SIGSEGV, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGFPE, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGILL, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGBUS, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGABRT, &act, nullptr) < 0)
			return EXIT_FAILURE;
	}

	// Don't allow the main thread to handle abort signals.
	sigset_t mask;
	sigemptyset(&mask);
	sigaddset(&mask, SIGABRT);
	sigset_t old_mask;
	if (pthread_sigmask(SIG_BLOCK, &mask, &old_mask) < 0)
		return EXIT_FAILURE;

	int ret = run_normal_process(replayer, databases, nullptr, 0, Global::metadata_fd);
	global_replayer = nullptr;

	if (!replayer_opts.disable_signal_handler)
	{
		// Cannot reliably handle these signals if they occur during teardown of the process.
		signal(SIGSEGV, SIG_DFL);
		signal(SIGFPE, SIG_DFL);
		signal(SIGILL, SIG_DFL);
		signal(SIGBUS, SIG_DFL);
		signal(SIGABRT, SIG_DFL);
	}
	pthread_sigmask(SIG_SETMASK, &old_mask, nullptr);

	free(alt_stack.ss_sp);

#if 0
	if (Global::control_block)
	{
		futex_wrapper_lock(&Global::control_block->futex_lock);
		char msg[ControlBlockMessageSize] = {};
		sprintf(msg, "SLAVE_FINISHED\n");
		shared_control_block_write(Global::control_block, msg, sizeof(msg));
		futex_wrapper_unlock(&Global::control_block->futex_lock);
	}
#endif

	return ret;
}